

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

void __thiscall
kj::anon_unknown_59::AppendableFileImpl::~AppendableFileImpl(AppendableFileImpl *this)

{
  File *pFVar1;
  Disposer *pDVar2;
  
  pFVar1 = (this->file).ptr;
  if (pFVar1 != (File *)0x0) {
    (this->file).ptr = (File *)0x0;
    pDVar2 = (this->file).disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(pFVar1->super_ReadableFile).super_FsNode._vptr_FsNode[-2] +
                      (long)&(pFVar1->super_ReadableFile).super_FsNode._vptr_FsNode);
  }
  ArrayOutputStream::~ArrayOutputStream
            ((ArrayOutputStream *)&(this->super_AppendableFile).super_OutputStream);
  operator_delete(this,0x20);
  return;
}

Assistant:

AppendableFileImpl(Own<const File>&& fileParam): file(kj::mv(fileParam)) {}